

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCompressedTexture.cpp
# Opt level: O0

void tcu::anon_unknown_0::decompressETC2_RGB8_PUNCHTHROUGH_ALPHA1
               (PixelBufferAccess *dst,deUint8 *src)

{
  int iVar1;
  void *pvVar2;
  deUint64 src_00;
  deUint8 *pdVar3;
  long lVar4;
  deUint8 *dstPixel;
  deUint8 *srcPixelAlpha;
  deUint8 *srcPixel;
  int x;
  int y;
  deUint8 uncompressedBlockAlpha [16];
  deUint8 uncompressedBlockRGB [48];
  deUint64 compressedBlockRGBA;
  int dstPixelSize;
  int dstRowPitch;
  deUint8 *dstPtr;
  deUint8 *src_local;
  PixelBufferAccess *dst_local;
  
  pvVar2 = PixelBufferAccess::getDataPtr(dst);
  iVar1 = ConstPixelBufferAccess::getRowPitch(&dst->super_ConstPixelBufferAccess);
  src_00 = EtcDecompressInternal::get64BitBlock(src,0);
  EtcDecompressInternal::decompressETC2Block(uncompressedBlockAlpha + 8,src_00,(deUint8 *)&x,true);
  for (srcPixel._4_4_ = 0; srcPixel._4_4_ < 4; srcPixel._4_4_ = srcPixel._4_4_ + 1) {
    for (srcPixel._0_4_ = 0; (int)srcPixel < 4; srcPixel._0_4_ = (int)srcPixel + 1) {
      lVar4 = (long)((srcPixel._4_4_ * 4 + (int)srcPixel) * 3);
      pdVar3 = (deUint8 *)
               ((long)pvVar2 + (long)((int)srcPixel << 2) + (long)(srcPixel._4_4_ * iVar1));
      *pdVar3 = uncompressedBlockAlpha[lVar4 + 8];
      pdVar3[1] = uncompressedBlockAlpha[lVar4 + 9];
      pdVar3[2] = uncompressedBlockAlpha[lVar4 + 10];
      pdVar3[3] = *(deUint8 *)((long)&x + (long)(srcPixel._4_4_ * 4 + (int)srcPixel));
    }
  }
  return;
}

Assistant:

void decompressETC2_RGB8_PUNCHTHROUGH_ALPHA1 (const PixelBufferAccess& dst, const deUint8* src)
{
	using namespace EtcDecompressInternal;

	deUint8* const	dstPtr			= (deUint8*)dst.getDataPtr();
	const int		dstRowPitch		= dst.getRowPitch();
	const int		dstPixelSize	= ETC2_UNCOMPRESSED_PIXEL_SIZE_RGBA8;

	const deUint64	compressedBlockRGBA	= get64BitBlock(src, 0);
	deUint8			uncompressedBlockRGB[ETC2_UNCOMPRESSED_BLOCK_SIZE_RGB8];
	deUint8			uncompressedBlockAlpha[ETC2_UNCOMPRESSED_BLOCK_SIZE_A8];

	// Decompress.
	decompressETC2Block(uncompressedBlockRGB, compressedBlockRGBA, uncompressedBlockAlpha, DE_TRUE);

	// Write to dst.
	for (int y = 0; y < (int)ETC2_BLOCK_HEIGHT; y++)
	{
		for (int x = 0; x < (int)ETC2_BLOCK_WIDTH; x++)
		{
			const deUint8* const	srcPixel		= &uncompressedBlockRGB[(y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_RGB8];
			const deUint8* const	srcPixelAlpha	= &uncompressedBlockAlpha[(y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_A8];
			deUint8* const			dstPixel		= dstPtr + y*dstRowPitch + x*dstPixelSize;

			DE_STATIC_ASSERT(ETC2_UNCOMPRESSED_PIXEL_SIZE_RGBA8 == 4);
			dstPixel[0] = srcPixel[0];
			dstPixel[1] = srcPixel[1];
			dstPixel[2] = srcPixel[2];
			dstPixel[3] = srcPixelAlpha[0];
		}
	}
}